

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

string * CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name_abi_cxx11_
                   (TreeEnsembleParameters_TreeNode_TreeNodeBehavior value)

{
  int iVar1;
  string *local_30;
  int idx;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior value_local;
  
  if (TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name[abi:cxx11](CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name[abi:cxx11](CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior)
                                 ::dummy);
    if (iVar1 != 0) {
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
                      (int *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,7,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings_abi_cxx11_);
      __cxa_guard_release(&TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name[abi:cxx11](CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
                     (int *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,7,
                     value);
  if (iVar1 == -1) {
    local_30 = google::protobuf::internal::GetEmptyString_abi_cxx11_();
  }
  else {
    local_30 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings_abi_cxx11_ +
                        (long)iVar1 * 0x20));
  }
  return local_30;
}

Assistant:

const std::string& TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name(
    TreeEnsembleParameters_TreeNode_TreeNodeBehavior value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
          TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,
          7, TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,
      7, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings[idx].get();
}